

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::updateDual(HDual *this)

{
  double theta;
  int iCol;
  double *pdVar1;
  HDualRow *this_00;
  int i;
  long lVar2;
  
  if (this->invertHint != 0) {
    return;
  }
  theta = this->thetaDual;
  if ((theta != 0.0) || (NAN(theta))) {
    HDualRow::update_dual(&this->dualRow,theta);
    if ((this->dual_variant != 0) && (this->slice_PRICE != 0)) {
      this_00 = this->slice_dualRow;
      for (lVar2 = 0; lVar2 < this->slice_num; lVar2 = lVar2 + 1) {
        HDualRow::update_dual(this_00,this->thetaDual);
        this_00 = this_00 + 1;
      }
    }
  }
  else {
    HModel::shiftCost(this->model,this->columnIn,-this->workDual[this->columnIn]);
  }
  pdVar1 = this->workDual;
  pdVar1[this->columnIn] = 0.0;
  iCol = this->columnOut;
  pdVar1[iCol] = -this->thetaDual;
  HModel::shiftBack(this->model,iCol);
  return;
}

Assistant:

void HDual::updateDual() {
	if (invertHint)
		return;

	// Update - dual (shift and back)
	if (thetaDual == 0)
		model->shiftCost(columnIn, -workDual[columnIn]);
	else {
		dualRow.update_dual(thetaDual);
		if (dual_variant != HDUAL_VARIANT_PLAIN && slice_PRICE)
			for (int i = 0; i < slice_num; i++)
				slice_dualRow[i].update_dual(thetaDual);
	}
	workDual[columnIn] = 0;
	workDual[columnOut] = -thetaDual;
	model->shiftBack(columnOut);
}